

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cc
# Opt level: O0

void learn(print *p,base_learner *param_2,example *ec)

{
  char *pcVar1;
  ostream *poVar2;
  size_t sVar3;
  char **ppcVar4;
  example *in_RDX;
  vw *in_RSI;
  label_data *ld;
  vw *dat;
  
  dat = (vw *)&in_RDX->l;
  if ((((label_data *)dat)->label != 3.4028235e+38) || (NAN(((label_data *)dat)->label))) {
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,((label_data *)dat)->label);
    std::operator<<(poVar2," ");
    if ((in_RDX->weight != 1.0) ||
       (((NAN(in_RDX->weight) || (*(float *)&dat->p != 0.0)) || (NAN(*(float *)&dat->p))))) {
      poVar2 = (ostream *)std::ostream::operator<<(&std::cout,in_RDX->weight);
      std::operator<<(poVar2," ");
      if ((*(float *)&dat->p != 0.0) || (NAN(*(float *)&dat->p))) {
        poVar2 = (ostream *)std::ostream::operator<<(&std::cout,*(float *)&dat->p);
        std::operator<<(poVar2," ");
      }
    }
  }
  sVar3 = v_array<char>::size(&in_RDX->tag);
  if (sVar3 != 0) {
    std::operator<<((ostream *)&std::cout,'\'');
    ppcVar4 = v_array<char>::begin(&in_RDX->tag);
    pcVar1 = *ppcVar4;
    v_array<char>::size(&in_RDX->tag);
    std::ostream::write((char *)&std::cout,(long)pcVar1);
  }
  std::operator<<((ostream *)&std::cout,"| ");
  GD::foreach_feature<vw,_unsigned_long,_&print_feature>(in_RSI,in_RDX,dat);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void learn(print& p, LEARNER::base_learner&, example& ec)
{
  label_data& ld = ec.l.simple;
  if (ld.label != FLT_MAX)
  {
    cout << ld.label << " ";
    if (ec.weight != 1 || ld.initial != 0)
    {
      cout << ec.weight << " ";
      if (ld.initial != 0)
        cout << ld.initial << " ";
    }
  }
  if (ec.tag.size() > 0)
  {
    cout << '\'';
    cout.write(ec.tag.begin(), ec.tag.size());
  }
  cout << "| ";
  GD::foreach_feature<vw, uint64_t, print_feature>(*(p.all), ec, *p.all);
  cout << endl;
}